

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O3

void __thiscall QTextEdit::focusOutEvent(QTextEdit *this,QFocusEvent *e)

{
  long lVar1;
  QWidgetTextControl *this_00;
  LayoutDirection LVar2;
  int iVar3;
  int iVar4;
  long in_FS_OFFSET;
  QPointF local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  QWidget::focusOutEvent((QWidget *)this,e);
  this_00 = *(QWidgetTextControl **)(lVar1 + 0x2f8);
  LVar2 = QWidget::layoutDirection(*(QWidget **)(lVar1 + 8));
  if (LVar2 == RightToLeft) {
    iVar3 = QAbstractSlider::maximum(*(QAbstractSlider **)(lVar1 + 0x288));
    iVar4 = QAbstractSlider::value(*(QAbstractSlider **)(lVar1 + 0x288));
    iVar3 = iVar3 - iVar4;
  }
  else {
    iVar3 = QAbstractSlider::value(*(QAbstractSlider **)(lVar1 + 0x288));
  }
  iVar4 = QAbstractSlider::value(*(QAbstractSlider **)(lVar1 + 0x290));
  local_38.yp = (qreal)iVar4;
  local_38.xp = (double)iVar3;
  QWidgetTextControl::processEvent(this_00,(QEvent *)e,&local_38,*(QWidget **)(lVar1 + 0x2b0));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextEdit::focusOutEvent(QFocusEvent *e)
{
    Q_D(QTextEdit);
    QAbstractScrollArea::focusOutEvent(e);
    d->sendControlEvent(e);
}